

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmJSONHelpers.h
# Opt level: O1

Object<cmCMakePresetsGraph::TestPreset::FilterOptions> * __thiscall
cmJSONHelperBuilder<cmCMakePresetsGraph::ReadFileResult>::
Object<cmCMakePresetsGraph::TestPreset::FilterOptions>::
Bind<cmCMakePresetsGraph::TestPreset::FilterOptions,std::optional<cmCMakePresetsGraph::TestPreset::ExcludeOptions>,std::function<cmCMakePresetsGraph::ReadFileResult(std::optional<cmCMakePresetsGraph::TestPreset::ExcludeOptions>&,Json::Value_const*)>>
          (Object<cmCMakePresetsGraph::TestPreset::FilterOptions> *this,string_view *name,
          offset_in_FilterOptions_to_optional<cmCMakePresetsGraph::TestPreset::ExcludeOptions>
          member,function<cmCMakePresetsGraph::ReadFileResult_(std::optional<cmCMakePresetsGraph::TestPreset::ExcludeOptions>_&,_const_Json::Value_*)>
                 *func,bool required)

{
  Object<cmCMakePresetsGraph::TestPreset::FilterOptions> *pOVar1;
  _Any_data local_70;
  _Manager_type local_60;
  _Any_data local_50;
  _Manager_type local_40;
  offset_in_FilterOptions_to_optional<cmCMakePresetsGraph::TestPreset::ExcludeOptions> local_30;
  
  std::
  function<cmCMakePresetsGraph::ReadFileResult_(std::optional<cmCMakePresetsGraph::TestPreset::ExcludeOptions>_&,_const_Json::Value_*)>
  ::function((function<cmCMakePresetsGraph::ReadFileResult_(std::optional<cmCMakePresetsGraph::TestPreset::ExcludeOptions>_&,_const_Json::Value_*)>
              *)&local_50,func);
  local_30 = member;
  std::
  function<cmCMakePresetsGraph::ReadFileResult(cmCMakePresetsGraph::TestPreset::FilterOptions&,Json::Value_const*)>
  ::
  function<cmJSONHelperBuilder<cmCMakePresetsGraph::ReadFileResult>::Object<cmCMakePresetsGraph::TestPreset::FilterOptions>::Bind<cmCMakePresetsGraph::TestPreset::FilterOptions,std::optional<cmCMakePresetsGraph::TestPreset::ExcludeOptions>,std::function<cmCMakePresetsGraph::ReadFileResult(std::optional<cmCMakePresetsGraph::TestPreset::ExcludeOptions>&,Json::Value_const*)>>(std::basic_string_view<char,std::char_traits<char>>const&,std::optional<cmCMakePresetsGraph::TestPreset::ExcludeOptions>cmCMakePresetsGraph::TestPreset::FilterOptions::*,std::function<cmCMakePresetsGraph::ReadFileResult(std::optional<cmCMakePresetsGraph::TestPreset::ExcludeOptions>&,Json::Value_const*)>,bool)::_lambda(cmCMakePresetsGraph::TestPreset::FilterOptions&,Json::Value_const*)_1_,void>
            ((function<cmCMakePresetsGraph::ReadFileResult(cmCMakePresetsGraph::TestPreset::FilterOptions&,Json::Value_const*)>
              *)local_70._M_pod_data,(anon_class_40_2_315d8239 *)&local_50);
  pOVar1 = BindPrivate(this,name,(MemberFunction *)&local_70,required);
  if (local_60 != (code *)0x0) {
    (*local_60)(&local_70,&local_70,__destroy_functor);
  }
  if (local_40 != (code *)0x0) {
    (*local_40)(&local_50,&local_50,__destroy_functor);
  }
  return pOVar1;
}

Assistant:

Object& Bind(const cm::string_view& name, M U::*member, F func,
                 bool required = true)
    {
      return this->BindPrivate(name,
                               [func, member](T& out, const Json::Value* value,
                                              CallState&&... state) -> E {
                                 return func(out.*member, value,
                                             std::forward(state)...);
                               },
                               required);
    }